

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O1

bool __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::set(option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (*(this->super_option_base)._vptr_option_base[0xc])(&local_30,this,value);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->actual,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  this->has = true;
  return true;
}

Assistant:

bool set(const std::string &value) {
      try {
        actual = read(value);
        has = true;
      } catch (const std::exception &e) {
        return false;
      }
      return true;
    }